

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O3

Kinematics * __thiscall
stateObservation::kine::Kinematics::setToProductNoAlias
          (Kinematics *__return_storage_ptr__,Kinematics *this,Kinematics *multiplier1,
          Kinematics *multiplier2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  bool bVar16;
  byte bVar17;
  long lVar18;
  char *__function;
  SrcEvaluatorType srcEvaluator;
  Matrix<double,_3,_3,_0,_3,_3> *pMVar19;
  Matrix<double,_3,_3,_0,_3,_3> *pMVar20;
  byte bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  Vector3 local_58;
  Matrix<double,_3,_1,_0,_3,_1> *local_40;
  Vector3 *local_38;
  
  bVar21 = 0;
  if (((multiplier1->orientation).m_.isSet_.b_ == false) &&
     (((multiplier1->orientation).q_.isSet_.b_ & 1U) == 0)) {
    __assert_fail("multiplier1.orientation.isSet() && \"The multiplier 1 orientation is not initialized, the multiplication is not possible.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                  ,0x67d,
                  "Kinematics stateObservation::kine::Kinematics::setToProductNoAlias(const Kinematics &, const Kinematics &)"
                 );
  }
  if ((multiplier2->position).isSet_.b_ == false) {
    if (((multiplier2->orientation).m_.isSet_.b_ == false) &&
       (((multiplier2->orientation).q_.isSet_.b_ & 1U) == 0)) {
      __assert_fail("(multiplier2.position.isSet() || multiplier2.orientation.isSet()) && \"The multiplier 2 kinematics is not initialized, the multiplication is not possible.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                    ,0x680,
                    "Kinematics stateObservation::kine::Kinematics::setToProductNoAlias(const Kinematics &, const Kinematics &)"
                   );
    }
LAB_00119e0c:
    (this->position).isSet_.b_ = false;
    (this->linVel).isSet_.b_ = false;
    (this->linAcc).isSet_.b_ = false;
LAB_0011a07f:
    if (((multiplier2->orientation).m_.isSet_.b_ == false) &&
       (((multiplier2->orientation).q_.isSet_.b_ & 1U) == 0)) {
      (this->orientation).q_.isSet_.b_ = false;
      (this->orientation).m_.isSet_.b_ = false;
    }
    else {
      Orientation::setToProductNoAlias
                (&this->orientation,&multiplier1->orientation,&multiplier2->orientation);
      if (((multiplier2->angVel).isSet_.b_ == true) && ((multiplier1->angVel).isSet_.b_ == true)) {
        (this->angVel).isSet_.b_ = true;
        if ((((this->angVel).assertMsg_.b_ != (char *)0x0) &&
            ((multiplier2->angVel).isSet_.b_ == true)) &&
           ((multiplier2->angVel).assertMsg_.b_ != (char *)0x0)) {
          bVar17 = (multiplier1->orientation).m_.isSet_.b_;
          if ((multiplier1->orientation).q_.isSet_.b_ == false) {
            if ((bVar17 & 1) == 0) goto LAB_0011ac01;
          }
          else if ((bVar17 & 1) == 0) {
            if ((multiplier1->orientation).q_.assertMsg_.b_ == (char *)0x0) goto LAB_0011ac20;
            dVar1 = (multiplier1->orientation).q_.v_.m_coeffs.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array[0];
            dVar2 = *(double *)
                     ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data + 0x18);
            dVar23 = dVar1 * (dVar1 + dVar1);
            dVar22 = (dVar1 + dVar1) * dVar2;
            dVar24 = *(double *)
                      ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                              super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                              .m_data + 8);
            dVar3 = *(double *)
                     ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data + 0x10);
            dVar25 = dVar24 + dVar24;
            dVar26 = dVar3 + dVar3;
            dVar12 = dVar1 * dVar25 - dVar26 * dVar2;
            (multiplier1->orientation).m_.isSet_.b_ = true;
            (multiplier1->orientation).m_.v_.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
                 1.0 - (dVar25 * dVar24 + dVar26 * dVar3);
            *(double *)
             ((long)(multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 8) = dVar1 * dVar25 + dVar26 * dVar2;
            auVar10._8_4_ = SUB84(dVar12,0);
            auVar10._0_8_ = dVar1 * dVar26 - dVar25 * dVar2;
            auVar10._12_4_ = (int)((ulong)dVar12 >> 0x20);
            *(undefined1 (*) [16])
             ((long)(multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x10) = auVar10;
            *(double *)
             ((long)(multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x20) = 1.0 - (dVar26 * dVar3 + dVar23);
            *(double *)
             ((long)(multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x28) = dVar26 * dVar24 + dVar22;
            *(double *)
             ((long)(multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x30) = dVar1 * dVar26 + dVar25 * dVar2;
            *(double *)
             ((long)(multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x38) = dVar26 * dVar24 - dVar22;
            *(double *)
             ((long)(multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x40) = 1.0 - (dVar25 * dVar24 + dVar23);
            bVar17 = 1;
          }
          if (((bVar17 & 1) == 0) || ((multiplier1->orientation).m_.assertMsg_.b_ == (char *)0x0)) {
LAB_0011abea:
            __function = 
            "bool stateObservation::CheckedItem<Eigen::Matrix<double, 3, 3>, false, false, true, true>::chckitm_check_() const [T = Eigen::Matrix<double, 3, 3>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
            ;
            goto LAB_0011aba2;
          }
          dVar2 = (multiplier2->angVel).v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[0];
          dVar12 = *(double *)
                    ((long)(multiplier1->orientation).m_.v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array + 8);
          dVar23 = *(double *)
                    ((long)(multiplier1->orientation).m_.v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array + 0x20);
          dVar24 = (multiplier2->angVel).v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[1];
          dVar3 = (multiplier2->angVel).v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2];
          dVar22 = *(double *)
                    ((long)(multiplier1->orientation).m_.v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array + 0x38);
          dVar1 = dVar3 * *(double *)
                           ((long)(multiplier1->orientation).m_.v_.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array + 0x40) +
                  dVar24 * *(double *)
                            ((long)(multiplier1->orientation).m_.v_.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data.array + 0x28) +
                  dVar2 * *(double *)
                           ((long)(multiplier1->orientation).m_.v_.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array + 0x10);
          (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[0] =
               *(double *)
                ((long)(multiplier1->orientation).m_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array + 0x30) * dVar3 +
               dVar24 * *(double *)
                         ((long)(multiplier1->orientation).m_.v_.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array + 0x18) +
               dVar2 * (multiplier1->orientation).m_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[0];
          (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[1] = dVar22 * dVar3 + dVar24 * dVar23 + dVar2 * dVar12;
          (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2] = dVar1;
          if (((multiplier2->angAcc).isSet_.b_ == true) && ((multiplier1->angAcc).isSet_.b_ == true)
             ) {
            (this->angAcc).isSet_.b_ = true;
            if (((multiplier2->angAcc).isSet_.b_ == true) &&
               ((multiplier2->angAcc).assertMsg_.b_ != (char *)0x0)) {
              bVar17 = (multiplier1->orientation).m_.isSet_.b_;
              if ((multiplier1->orientation).q_.isSet_.b_ == false) {
                if ((bVar17 & 1) == 0) {
LAB_0011ac01:
                  __assert_fail("(isQuaternionSet() || isMatrixSet()) && \"The orientation is not initialized\""
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                                ,0x3ef,"void stateObservation::kine::Orientation::check_() const");
                }
              }
              else if ((bVar17 & 1) == 0) {
                if ((multiplier1->orientation).q_.assertMsg_.b_ == (char *)0x0) goto LAB_0011ac20;
                dVar1 = (multiplier1->orientation).q_.v_.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array[0];
                dVar2 = *(double *)
                         ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data + 0x18);
                dVar23 = dVar1 * (dVar1 + dVar1);
                dVar22 = (dVar1 + dVar1) * dVar2;
                dVar24 = *(double *)
                          ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                  m_storage.m_data + 8);
                dVar3 = *(double *)
                         ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data + 0x10);
                dVar25 = dVar24 + dVar24;
                dVar26 = dVar3 + dVar3;
                dVar12 = dVar1 * dVar25 - dVar26 * dVar2;
                (multiplier1->orientation).m_.isSet_.b_ = true;
                (multiplier1->orientation).m_.v_.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [0] = 1.0 - (dVar25 * dVar24 + dVar26 * dVar3);
                *(double *)
                 ((long)(multiplier1->orientation).m_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 8) = dVar1 * dVar25 + dVar26 * dVar2;
                auVar11._8_4_ = SUB84(dVar12,0);
                auVar11._0_8_ = dVar1 * dVar26 - dVar25 * dVar2;
                auVar11._12_4_ = (int)((ulong)dVar12 >> 0x20);
                *(undefined1 (*) [16])
                 ((long)(multiplier1->orientation).m_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 0x10) = auVar11;
                *(double *)
                 ((long)(multiplier1->orientation).m_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 0x20) = 1.0 - (dVar26 * dVar3 + dVar23);
                *(double *)
                 ((long)(multiplier1->orientation).m_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 0x28) = dVar26 * dVar24 + dVar22;
                *(double *)
                 ((long)(multiplier1->orientation).m_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 0x30) = dVar1 * dVar26 + dVar25 * dVar2;
                *(double *)
                 ((long)(multiplier1->orientation).m_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 0x38) = dVar26 * dVar24 - dVar22;
                *(double *)
                 ((long)(multiplier1->orientation).m_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 0x40) = 1.0 - (dVar25 * dVar24 + dVar23);
                bVar17 = 1;
              }
              if (((bVar17 & 1) == 0) ||
                 ((multiplier1->orientation).m_.assertMsg_.b_ == (char *)0x0)) goto LAB_0011abea;
              if (((this->angAcc).isSet_.b_ == true) &&
                 ((this->angAcc).assertMsg_.b_ != (char *)0x0)) {
                dVar1 = (multiplier2->angAcc).v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[0];
                dVar2 = (multiplier2->angAcc).v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[1];
                dVar12 = (multiplier2->angAcc).v_.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[2];
                dVar23 = *(double *)
                          ((long)(multiplier1->orientation).m_.v_.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array + 0x30) * dVar12 +
                         dVar2 * *(double *)
                                  ((long)(multiplier1->orientation).m_.v_.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array + 0x18) +
                         dVar1 * (multiplier1->orientation).m_.v_.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[0];
                dVar24 = *(double *)
                          ((long)(multiplier1->orientation).m_.v_.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array + 0x38) * dVar12 +
                         dVar2 * *(double *)
                                  ((long)(multiplier1->orientation).m_.v_.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array + 0x20) +
                         dVar1 * *(double *)
                                  ((long)(multiplier1->orientation).m_.v_.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array + 8);
                dVar2 = dVar12 * *(double *)
                                  ((long)(multiplier1->orientation).m_.v_.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array + 0x40) +
                        dVar2 * *(double *)
                                 ((long)(multiplier1->orientation).m_.v_.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        .m_storage.m_data.array + 0x28) +
                        dVar1 * *(double *)
                                 ((long)(multiplier1->orientation).m_.v_.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        .m_storage.m_data.array + 0x10);
                (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[0] = dVar23;
                (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[1] = dVar24;
                (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[2] = dVar2;
                if (((multiplier1->angVel).isSet_.b_ == true) &&
                   ((multiplier1->angVel).assertMsg_.b_ != (char *)0x0)) {
                  dVar12 = (this->angVel).v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[0];
                  dVar3 = (multiplier1->angVel).v_.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0];
                  dVar22 = (multiplier1->angVel).v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[1];
                  dVar25 = (multiplier1->angVel).v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[2];
                  dVar26 = (this->angVel).v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[1];
                  dVar1 = (this->angVel).v_.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2];
                  dVar23 = dVar23 + (dVar1 * dVar22 - dVar25 * dVar26);
                  dVar24 = dVar24 + (dVar12 * dVar25 - dVar3 * dVar1);
                  (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[0] = dVar23;
                  (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[1] = dVar24;
                  dVar2 = dVar2 + (dVar3 * dVar26 - dVar12 * dVar22);
                  (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[2] = dVar2;
                  if (((multiplier1->angAcc).isSet_.b_ == true) &&
                     ((multiplier1->angAcc).assertMsg_.b_ != (char *)0x0)) {
                    dVar12 = (multiplier1->angAcc).v_.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array[1];
                    (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[0] =
                         dVar23 + (multiplier1->angAcc).v_.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[0];
                    (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[1] = dVar24 + dVar12;
                    (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2] =
                         dVar2 + (multiplier1->angAcc).v_.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2];
                    goto LAB_0011ab2e;
                  }
                }
              }
            }
          }
          else {
            (this->angAcc).isSet_.b_ = false;
LAB_0011ab2e:
            if (((((multiplier1->angVel).isSet_.b_ == true) &&
                 ((multiplier1->angVel).assertMsg_.b_ != (char *)0x0)) &&
                ((this->angVel).isSet_.b_ == true)) && ((this->angVel).assertMsg_.b_ != (char *)0x0)
               ) {
              dVar2 = (multiplier1->angVel).v_.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array[1];
              dVar12 = (this->angVel).v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[1];
              (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0] =
                   (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0] +
                   (multiplier1->angVel).v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[0];
              (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1] = dVar12 + dVar2;
              (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2] =
                   dVar1 + (multiplier1->angVel).v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[2];
              bVar16 = true;
              goto LAB_0011a234;
            }
          }
        }
        goto LAB_0011ab8d;
      }
    }
    bVar16 = false;
    (this->angVel).isSet_.b_ = false;
    (this->angAcc).isSet_.b_ = false;
LAB_0011a234:
    (__return_storage_ptr__->position)._vptr_CheckedItem = (_func_int **)&PTR__CheckedItem_00121d38;
    dVar1 = (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1];
    (__return_storage_ptr__->position).v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    (__return_storage_ptr__->position).v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = dVar1;
    (__return_storage_ptr__->position).v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    (__return_storage_ptr__->position).isSet_.b_ = (this->position).isSet_.b_;
    (__return_storage_ptr__->position).assertMsg_.b_ = (this->position).assertMsg_.b_;
    (__return_storage_ptr__->orientation).q_._vptr_CheckedItem =
         (_func_int **)&PTR__CheckedItem_00121cd8;
    dVar1 = *(double *)
             ((long)&(this->orientation).q_.v_.m_coeffs.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data +
             8);
    dVar2 = *(double *)
             ((long)&(this->orientation).q_.v_.m_coeffs.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data +
             0x10);
    dVar12 = *(double *)
              ((long)&(this->orientation).q_.v_.m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
              + 0x18);
    (__return_storage_ptr__->orientation).q_.v_.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         (this->orientation).q_.v_.m_coeffs.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
    *(double *)
     ((long)&(__return_storage_ptr__->orientation).q_.v_.m_coeffs.
             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data + 8) =
         dVar1;
    *(double *)
     ((long)&(__return_storage_ptr__->orientation).q_.v_.m_coeffs.
             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data + 0x10) =
         dVar2;
    *(double *)
     ((long)&(__return_storage_ptr__->orientation).q_.v_.m_coeffs.
             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data + 0x18) =
         dVar12;
    (__return_storage_ptr__->orientation).q_.isSet_.b_ = (this->orientation).q_.isSet_.b_;
    (__return_storage_ptr__->orientation).q_.assertMsg_.b_ = (this->orientation).q_.assertMsg_.b_;
    (__return_storage_ptr__->orientation).m_._vptr_CheckedItem =
         (_func_int **)&PTR__CheckedItem_00121d08;
    pMVar19 = &(this->orientation).m_.v_;
    pMVar20 = &(__return_storage_ptr__->orientation).m_.v_;
    for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
      (pMVar20->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
      [0] = (pMVar19->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
            .array[0];
      pMVar19 = (Matrix<double,_3,_3,_0,_3,_3> *)((long)pMVar19 + (ulong)bVar21 * -0x10 + 8);
      pMVar20 = (Matrix<double,_3,_3,_0,_3,_3> *)((long)pMVar20 + (ulong)bVar21 * -0x10 + 8);
    }
    (__return_storage_ptr__->orientation).m_.isSet_.b_ = (this->orientation).m_.isSet_.b_;
    (__return_storage_ptr__->orientation).m_.assertMsg_.b_ = (this->orientation).m_.assertMsg_.b_;
    (__return_storage_ptr__->linVel)._vptr_CheckedItem = (_func_int **)&PTR__CheckedItem_00121d38;
    dVar1 = (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
            .m_data.array[1];
    (__return_storage_ptr__->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[0] =
         (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    (__return_storage_ptr__->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[1] = dVar1;
    (__return_storage_ptr__->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[2] =
         (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    (__return_storage_ptr__->linVel).isSet_.b_ = (this->linVel).isSet_.b_;
    (__return_storage_ptr__->linVel).assertMsg_.b_ = (this->linVel).assertMsg_.b_;
    (__return_storage_ptr__->angVel)._vptr_CheckedItem = (_func_int **)&PTR__CheckedItem_00121d38;
    dVar1 = (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
            .m_data.array[1];
    (__return_storage_ptr__->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[0] =
         (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    (__return_storage_ptr__->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[1] = dVar1;
    (__return_storage_ptr__->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[2] =
         (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    (__return_storage_ptr__->angVel).isSet_.b_ = bVar16;
    (__return_storage_ptr__->angVel).assertMsg_.b_ = (this->angVel).assertMsg_.b_;
    (__return_storage_ptr__->linAcc)._vptr_CheckedItem = (_func_int **)&PTR__CheckedItem_00121d38;
    dVar1 = (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
            .m_data.array[1];
    (__return_storage_ptr__->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[0] =
         (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    (__return_storage_ptr__->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[1] = dVar1;
    (__return_storage_ptr__->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[2] =
         (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    (__return_storage_ptr__->linAcc).isSet_.b_ = (this->linAcc).isSet_.b_;
    (__return_storage_ptr__->linAcc).assertMsg_.b_ = (this->linAcc).assertMsg_.b_;
    (__return_storage_ptr__->angAcc)._vptr_CheckedItem = (_func_int **)&PTR__CheckedItem_00121d38;
    dVar1 = (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
            .m_data.array[1];
    (__return_storage_ptr__->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[0] =
         (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    (__return_storage_ptr__->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[1] = dVar1;
    (__return_storage_ptr__->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[2] =
         (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    (__return_storage_ptr__->angAcc).isSet_.b_ = (this->angAcc).isSet_.b_;
    (__return_storage_ptr__->angAcc).assertMsg_.b_ = (this->angAcc).assertMsg_.b_;
    dVar1 = (this->tempVec_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[1];
    (__return_storage_ptr__->tempVec_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] =
         (this->tempVec_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    (__return_storage_ptr__->tempVec_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] = dVar1;
    (__return_storage_ptr__->tempVec_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] =
         (this->tempVec_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    return __return_storage_ptr__;
  }
  if ((multiplier1->position).isSet_.b_ != true) goto LAB_00119e0c;
  (this->position).isSet_.b_ = true;
  if ((((this->position).assertMsg_.b_ == (char *)0x0) ||
      ((multiplier2->position).isSet_.b_ != true)) ||
     ((multiplier2->position).assertMsg_.b_ == (char *)0x0)) goto LAB_0011ab8d;
  bVar17 = (multiplier1->orientation).m_.isSet_.b_;
  if ((multiplier1->orientation).q_.isSet_.b_ != false) {
    if ((bVar17 & 1) != 0) goto LAB_00119e2d;
    if ((multiplier1->orientation).q_.assertMsg_.b_ != (char *)0x0) {
      dVar1 = (multiplier1->orientation).q_.v_.m_coeffs.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
      ;
      dVar2 = *(double *)
               ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
               + 0x18);
      dVar23 = dVar1 * (dVar1 + dVar1);
      dVar22 = (dVar1 + dVar1) * dVar2;
      dVar24 = *(double *)
                ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data + 8);
      dVar3 = *(double *)
               ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
               + 0x10);
      dVar25 = dVar24 + dVar24;
      dVar26 = dVar3 + dVar3;
      dVar12 = dVar1 * dVar25 - dVar26 * dVar2;
      (multiplier1->orientation).m_.isSet_.b_ = true;
      (multiplier1->orientation).m_.v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = 1.0 - (dVar25 * dVar24 + dVar26 * dVar3);
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       8) = dVar1 * dVar25 + dVar26 * dVar2;
      auVar4._8_4_ = SUB84(dVar12,0);
      auVar4._0_8_ = dVar1 * dVar26 - dVar25 * dVar2;
      auVar4._12_4_ = (int)((ulong)dVar12 >> 0x20);
      *(undefined1 (*) [16])
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x10) = auVar4;
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x20) = 1.0 - (dVar26 * dVar3 + dVar23);
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x28) = dVar26 * dVar24 + dVar22;
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x30) = dVar1 * dVar26 + dVar25 * dVar2;
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x38) = dVar26 * dVar24 - dVar22;
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x40) = 1.0 - (dVar25 * dVar24 + dVar23);
      bVar17 = 1;
      goto LAB_00119e2d;
    }
LAB_0011ac20:
    __function = 
    "bool stateObservation::CheckedItem<Eigen::Quaternion<double>, false, false, true, true>::chckitm_check_() const [T = Eigen::Quaternion<double>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
    ;
    goto LAB_0011aba2;
  }
  if ((bVar17 & 1) == 0) goto LAB_0011ac01;
LAB_00119e2d:
  if (((bVar17 & 1) == 0) || ((multiplier1->orientation).m_.assertMsg_.b_ == (char *)0x0))
  goto LAB_0011abea;
  dVar12 = (multiplier2->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
  dVar23 = *(double *)
            ((long)(multiplier1->orientation).m_.v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 8);
  dVar24 = (multiplier2->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1];
  dVar3 = (multiplier2->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[2];
  dVar22 = *(double *)
            ((long)(multiplier1->orientation).m_.v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 0x28);
  dVar1 = *(double *)
           ((long)(multiplier1->orientation).m_.v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 0x40);
  dVar25 = *(double *)
            ((long)(multiplier1->orientation).m_.v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 0x20);
  dVar26 = *(double *)
            ((long)(multiplier1->orientation).m_.v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 0x38);
  dVar2 = *(double *)
           ((long)(multiplier1->orientation).m_.v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 0x10);
  (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0] = dVar3 * *(double *)
                      ((long)(multiplier1->orientation).m_.v_.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + 0x30) +
             *(double *)
              ((long)(multiplier1->orientation).m_.v_.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array + 0x18) * dVar24 +
             dVar12 * (multiplier1->orientation).m_.v_.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                      array[0];
  (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[1] = dVar3 * dVar26 + dVar25 * dVar24 + dVar12 * dVar23;
  (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[2] = dVar1 * dVar3 + dVar22 * dVar24 + dVar12 * dVar2;
  if (((multiplier2->linVel).isSet_.b_ != true) ||
     (((multiplier1->linVel).isSet_.b_ != true || ((multiplier1->angVel).isSet_.b_ != true)))) {
    (this->linVel).isSet_.b_ = false;
    (this->linAcc).isSet_.b_ = false;
LAB_0011a02f:
    if ((((multiplier1->position).isSet_.b_ != true) ||
        ((multiplier1->position).assertMsg_.b_ == (char *)0x0)) ||
       (((this->position).isSet_.b_ != true || ((this->position).assertMsg_.b_ == (char *)0x0))))
    goto LAB_0011ab8d;
    dVar1 = (multiplier1->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1] +
            (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1];
    auVar9._8_4_ = SUB84(dVar1,0);
    auVar9._0_8_ = (multiplier1->position).v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[0] +
                   (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0];
    auVar9._12_4_ = (int)((ulong)dVar1 >> 0x20);
    *(undefined1 (*) [16])
     (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
     m_data.array = auVar9;
    (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] =
         (multiplier1->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2] +
         (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    goto LAB_0011a07f;
  }
  if ((multiplier2->linVel).assertMsg_.b_ != (char *)0x0) {
    bVar17 = (multiplier1->orientation).m_.isSet_.b_;
    if ((multiplier1->orientation).q_.isSet_.b_ == false) {
      if ((bVar17 & 1) == 0) goto LAB_0011ac01;
    }
    else if ((bVar17 & 1) == 0) {
      if ((multiplier1->orientation).q_.assertMsg_.b_ == (char *)0x0) goto LAB_0011ac20;
      dVar1 = (multiplier1->orientation).q_.v_.m_coeffs.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
      ;
      dVar2 = *(double *)
               ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
               + 0x18);
      dVar23 = dVar1 * (dVar1 + dVar1);
      dVar22 = (dVar1 + dVar1) * dVar2;
      dVar24 = *(double *)
                ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data + 8);
      dVar3 = *(double *)
               ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
               + 0x10);
      dVar25 = dVar24 + dVar24;
      dVar26 = dVar3 + dVar3;
      dVar12 = dVar1 * dVar25 - dVar26 * dVar2;
      (multiplier1->orientation).m_.isSet_.b_ = true;
      (multiplier1->orientation).m_.v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = 1.0 - (dVar25 * dVar24 + dVar26 * dVar3);
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       8) = dVar1 * dVar25 + dVar26 * dVar2;
      auVar5._8_4_ = SUB84(dVar12,0);
      auVar5._0_8_ = dVar1 * dVar26 - dVar25 * dVar2;
      auVar5._12_4_ = (int)((ulong)dVar12 >> 0x20);
      *(undefined1 (*) [16])
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x10) = auVar5;
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x20) = 1.0 - (dVar26 * dVar3 + dVar23);
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x28) = dVar26 * dVar24 + dVar22;
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x30) = dVar1 * dVar26 + dVar25 * dVar2;
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x38) = dVar26 * dVar24 - dVar22;
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x40) = 1.0 - (dVar25 * dVar24 + dVar23);
      bVar17 = 1;
    }
    if (((bVar17 & 1) == 0) || ((multiplier1->orientation).m_.assertMsg_.b_ == (char *)0x0))
    goto LAB_0011abea;
    dVar1 = (multiplier2->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[0];
    dVar23 = (multiplier2->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[1];
    dVar24 = (multiplier2->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[2];
    dVar2 = *(double *)
             ((long)(multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x30) * dVar24 +
            dVar23 * *(double *)
                      ((long)(multiplier1->orientation).m_.v_.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + 0x18) +
            dVar1 * (multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[0];
    dVar12 = *(double *)
              ((long)(multiplier1->orientation).m_.v_.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array + 0x38) * dVar24 +
             dVar23 * *(double *)
                       ((long)(multiplier1->orientation).m_.v_.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array + 0x20) +
             dVar1 * *(double *)
                      ((long)(multiplier1->orientation).m_.v_.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + 8);
    dVar1 = dVar24 * *(double *)
                      ((long)(multiplier1->orientation).m_.v_.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + 0x40) +
            dVar23 * *(double *)
                      ((long)(multiplier1->orientation).m_.v_.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + 0x28) +
            dVar1 * *(double *)
                     ((long)(multiplier1->orientation).m_.v_.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array + 0x10);
    auVar13._8_4_ = SUB84(dVar12,0);
    auVar13._0_8_ = dVar2;
    auVar13._12_4_ = (int)((ulong)dVar12 >> 0x20);
    *(undefined1 (*) [16])
     (this->tempVec_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
     array = auVar13;
    (this->tempVec_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = dVar1;
    (this->linVel).isSet_.b_ = true;
    if (((this->linVel).assertMsg_.b_ != (char *)0x0) &&
       (((multiplier1->angVel).isSet_.b_ == true &&
        ((multiplier1->angVel).assertMsg_.b_ != (char *)0x0)))) {
      dVar23 = (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[0];
      dVar24 = (multiplier1->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
               .m_storage.m_data.array[0];
      dVar3 = (multiplier1->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1];
      dVar22 = (multiplier1->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
               .m_storage.m_data.array[2];
      dVar25 = (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[1];
      dVar26 = (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2];
      dVar12 = dVar12 + (dVar23 * dVar22 - dVar24 * dVar26);
      auVar14._8_4_ = SUB84(dVar12,0);
      auVar14._0_8_ = dVar2 + (dVar26 * dVar3 - dVar22 * dVar25);
      auVar14._12_4_ = (int)((ulong)dVar12 >> 0x20);
      *(undefined1 (*) [16])
       (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
       m_data.array = auVar14;
      (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[2] = dVar1 + (dVar24 * dVar25 - dVar23 * dVar3);
      if (((multiplier2->linAcc).isSet_.b_ == true) &&
         (((multiplier1->linAcc).isSet_.b_ == true && ((multiplier1->angAcc).isSet_.b_ == true)))) {
        (this->linAcc).isSet_.b_ = true;
        if (((((multiplier2->linAcc).isSet_.b_ == true) &&
             ((multiplier2->linAcc).assertMsg_.b_ != (char *)0x0)) &&
            (Orientation::operator*(&local_58,&multiplier1->orientation,&(multiplier2->linAcc).v_),
            (this->linAcc).isSet_.b_ == true)) && ((this->linAcc).assertMsg_.b_ != (char *)0x0)) {
          (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[0] =
               local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
          (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[1] =
               local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
          (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2] =
               local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          if (((multiplier1->angAcc).isSet_.b_ == true) &&
             ((multiplier1->angAcc).assertMsg_.b_ != (char *)0x0)) {
            dVar1 = (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    .m_storage.m_data.array[0];
            dVar2 = (multiplier1->angAcc).v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array[0];
            dVar23 = (multiplier1->angAcc).v_.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[1];
            dVar24 = (multiplier1->angAcc).v_.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[2];
            dVar3 = (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    .m_storage.m_data.array[1];
            dVar22 = (this->position).v_.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[2];
            dVar12 = local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1] + (dVar1 * dVar24 - dVar2 * dVar22);
            auVar15._8_4_ = SUB84(dVar12,0);
            auVar15._0_8_ =
                 local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0] + (dVar22 * dVar23 - dVar24 * dVar3);
            auVar15._12_4_ = (int)((ulong)dVar12 >> 0x20);
            *(undefined1 (*) [16])
             (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array = auVar15;
            (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
            .m_data.array[2] =
                 local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2] + (dVar2 * dVar3 - dVar1 * dVar23);
            if (((multiplier1->angVel).isSet_.b_ == true) &&
               ((multiplier1->angVel).assertMsg_.b_ != (char *)0x0)) {
              local_38 = &this->tempVec_;
              local_40 = &(this->linVel).v_;
              Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
              cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                        (&local_58,&(multiplier1->angVel).v_,
                         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          *)&local_40);
              if (((this->linAcc).isSet_.b_ == true) &&
                 ((this->linAcc).assertMsg_.b_ != (char *)0x0)) {
                local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] =
                     local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0] +
                     (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
                local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1] =
                     local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1] +
                     (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
                auVar6._8_4_ = SUB84(local_58.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     m_storage.m_data.array[1],0);
                auVar6._0_8_ = local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                               .m_storage.m_data.array[0];
                auVar6._12_4_ =
                     (int)((ulong)local_58.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[1] >> 0x20);
                *(undefined1 (*) [16])
                 (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array = auVar6;
                local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] =
                     local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] +
                     (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2];
                (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[2] =
                     local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2];
                if (((multiplier1->linAcc).isSet_.b_ == true) &&
                   ((multiplier1->linAcc).assertMsg_.b_ != (char *)0x0)) {
                  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1] =
                       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[1] +
                       (multiplier1->linAcc).v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[1];
                  auVar7._8_4_ = SUB84(local_58.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                       m_storage.m_data.array[1],0);
                  auVar7._0_8_ = local_58.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0] +
                                 (multiplier1->linAcc).v_.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0];
                  auVar7._12_4_ =
                       (int)((ulong)local_58.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[1] >> 0x20);
                  *(undefined1 (*) [16])
                   (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array = auVar7;
                  (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[2] =
                       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[2] +
                       (multiplier1->linAcc).v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[2];
                  goto LAB_0011a92d;
                }
              }
            }
          }
        }
      }
      else {
        (this->linAcc).isSet_.b_ = false;
LAB_0011a92d:
        if (((((multiplier1->linVel).isSet_.b_ == true) &&
             ((multiplier1->linVel).assertMsg_.b_ != (char *)0x0)) &&
            ((this->linVel).isSet_.b_ == true)) && ((this->linVel).assertMsg_.b_ != (char *)0x0)) {
          dVar1 = (multiplier1->linVel).v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[1] +
                  (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[1];
          auVar8._8_4_ = SUB84(dVar1,0);
          auVar8._0_8_ = (multiplier1->linVel).v_.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[0] +
                         (this->linVel).v_.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[0];
          auVar8._12_4_ = (int)((ulong)dVar1 >> 0x20);
          *(undefined1 (*) [16])
           (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array = auVar8;
          (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2] =
               (multiplier1->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
               .m_storage.m_data.array[2] +
               (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2];
          goto LAB_0011a02f;
        }
      }
    }
  }
LAB_0011ab8d:
  __function = 
  "bool stateObservation::CheckedItem<Eigen::Matrix<double, 3, 1>, false, false, true, true>::chckitm_check_() const [T = Eigen::Matrix<double, 3, 1>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
  ;
LAB_0011aba2:
  __assert_fail("(isSet())&&(assertMsg_.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x69,__function);
}

Assistant:

inline Kinematics Kinematics::setToProductNoAlias(const Kinematics & multiplier1, const Kinematics & multiplier2)
{
  BOOST_ASSERT(multiplier1.orientation.isSet()
               && "The multiplier 1 orientation is not initialized, the multiplication is not possible.");

  BOOST_ASSERT((multiplier2.position.isSet() || multiplier2.orientation.isSet())
               && "The multiplier 2 kinematics is not initialized, the multiplication is not possible.");

  if(multiplier2.position.isSet() && multiplier1.position.isSet())
  {
    position.set(true);
    Vector3 & R1p2 = position(); /// reference ( Vector3&  )
    R1p2.noalias() = multiplier1.orientation * multiplier2.position();

    if(multiplier2.linVel.isSet() && multiplier1.linVel.isSet() && multiplier1.angVel.isSet())
    {
      Vector3 & R1p2d = tempVec_; /// reference
      R1p2d.noalias() = multiplier1.orientation * multiplier2.linVel();

      linVel.set(true);
      Vector3 & w1xR1p2 = linVel(); /// reference
      w1xR1p2.noalias() = multiplier1.angVel().cross(R1p2);

      Vector3 & w1xR1p2_R1p2d = w1xR1p2; ///  reference ( =linVel() )
      w1xR1p2_R1p2d += R1p2d;

      if(multiplier2.linAcc.isSet() && multiplier1.linAcc.isSet() && multiplier1.angAcc.isSet())
      {
        linAcc.set(true);
        linAcc().noalias() = multiplier1.orientation * multiplier2.linAcc();
        linAcc().noalias() += multiplier1.angAcc().cross(R1p2);
        linAcc().noalias() += multiplier1.angVel().cross(w1xR1p2_R1p2d + R1p2d);
        linAcc() += multiplier1.linAcc();
      }
      else
      {
        linAcc.reset();
      }

      linVel() += multiplier1.linVel();
    }
    else
    {
      linVel.reset();
      linAcc.reset();
    }

    position() += multiplier1.position();
  }
  else
  {
    position.reset();
    linVel.reset();
    linAcc.reset();
  }

  if(multiplier2.orientation.isSet())
  {
    orientation.setToProductNoAlias(multiplier1.orientation, multiplier2.orientation);

    if(multiplier2.angVel.isSet() && multiplier1.angVel.isSet())
    {
      angVel.set(true);
      Vector3 & R1w2 = angVel(); /// reference
      R1w2.noalias() = multiplier1.orientation * multiplier2.angVel();

      if(multiplier2.angAcc.isSet() && multiplier1.angAcc.isSet())
      {
        angAcc.set(true);
        angAcc().noalias() = multiplier1.orientation * multiplier2.angAcc();
        angAcc().noalias() += multiplier1.angVel().cross(R1w2);
        angAcc() += multiplier1.angAcc();
      }
      else
      {
        angAcc.reset();
      }

      angVel() += multiplier1.angVel();
    }
    else
    {
      angVel.reset();
      angAcc.reset();
    }
  }
  else
  {
    orientation.reset();
    angVel.reset();
    angAcc.reset();
  }

  return *this;
}